

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glist.c
# Opt level: O0

gnode_t * glist_insert_uint32(gnode_t *gn,uint32 val)

{
  gnode_t *pgVar1;
  anytype_t aVar2;
  gnode_t *newgn;
  uint32 val_local;
  gnode_t *gn_local;
  
  pgVar1 = (gnode_t *)
           __ckd_calloc__(1,0x10,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/util/glist.c"
                          ,0xdb);
  aVar2.i._4_4_ = 0;
  aVar2.ui._0_4_ = val;
  pgVar1->data = aVar2;
  pgVar1->next = gn->next;
  gn->next = pgVar1;
  return pgVar1;
}

Assistant:

gnode_t *
glist_insert_uint32(gnode_t * gn, uint32 val)
{
    gnode_t *newgn;

    newgn = (gnode_t *) ckd_calloc(1, sizeof(gnode_t));
    newgn->data.ui = val;
    newgn->next = gn->next;

    gn->next = newgn;

    return newgn;
}